

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators.hpp
# Opt level: O3

ModulePtr __thiscall chaiscript::bootstrap::operators::assign<bool>(operators *this,ModulePtr *m)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ModulePtr MVar4;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  fun<bool&,bool&,bool_const&>((chaiscript *)&local_50,detail::assign<bool&,bool_const&>);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"=","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_50,&local_40);
  _Var3._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (local_50.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_01;
  }
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  MVar4.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  MVar4.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModulePtr)MVar4.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr assign(ModulePtr m = std::make_shared<Module>())
        {
          m->add(chaiscript::fun(&detail::assign<T &, const T&>), "=");
          return m;
        }